

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O1

S2CellId __thiscall S2CellId::maximum_tile(S2CellId *this,S2CellId limit)

{
  S2CellId SVar1;
  S2CellId SVar2;
  ulong uVar3;
  ulong uVar4;
  S2CellId id;
  S2CellId local_20;
  
  local_20 = (S2CellId)this->id_;
  uVar3 = ~local_20.id_ & local_20.id_ - 1;
  uVar4 = local_20.id_ - uVar3;
  SVar2.id_ = limit.id_;
  if (uVar4 < limit.id_ - (~limit.id_ & limit.id_ - 1)) {
    if (uVar3 + local_20.id_ < limit.id_) {
      do {
        if ((local_20.id_ & 0xfffffffffffffff) == 0) {
          return (S2CellId)local_20.id_;
        }
        SVar1 = parent(&local_20);
        SVar2.id_ = local_20.id_;
        local_20 = SVar1;
      } while ((SVar1.id_ - 1 | SVar1.id_) < limit.id_ &&
               SVar1.id_ - (~SVar1.id_ & SVar1.id_ - 1) == uVar4);
    }
    else {
      do {
        SVar2 = child(&local_20,0);
        local_20 = SVar2;
      } while (limit.id_ <= (SVar2.id_ - 1 | SVar2.id_));
    }
  }
  return (S2CellId)SVar2.id_;
}

Assistant:

S2CellId S2CellId::maximum_tile(const S2CellId limit) const {
  S2CellId id = *this;
  S2CellId start = id.range_min();
  if (start >= limit.range_min()) return limit;

  if (id.range_max() >= limit) {
    // The cell is too large.  Shrink it.  Note that when generating coverings
    // of S2CellId ranges, this loop usually executes only once.  Also because
    // id.range_min() < limit.range_min(), we will always exit the loop by the
    // time we reach a leaf cell.
    do { id = id.child(0); } while (id.range_max() >= limit);
    return id;
  }
  // The cell may be too small.  Grow it if necessary.  Note that generally
  // this loop only iterates once.
  while (!id.is_face()) {
    S2CellId parent = id.parent();
    if (parent.range_min() != start || parent.range_max() >= limit) break;
    id = parent;
  }
  return id;
}